

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

void Mem_FlexRestart(Mem_Flex_t *p)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = p->nChunks;
  if (iVar2 != 0) {
    if (1 < iVar2) {
      lVar3 = 1;
      do {
        if (p->pChunks[lVar3] != (char *)0x0) {
          free(p->pChunks[lVar3]);
          p->pChunks[lVar3] = (char *)0x0;
          iVar2 = p->nChunks;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar2);
    }
    p->nChunks = 1;
    p->nMemoryAlloc = p->nChunkSize;
    pcVar1 = *p->pChunks;
    p->pCurrent = pcVar1;
    p->pEnd = pcVar1 + p->nChunkSize;
    p->nEntriesUsed = 0;
    p->nMemoryUsed = 0;
  }
  return;
}

Assistant:

void Mem_FlexRestart( Mem_Flex_t * p )
{
    int i;
    if ( p->nChunks == 0 )
        return;
    // deallocate all chunks except the first one
    for ( i = 1; i < p->nChunks; i++ )
        ABC_FREE( p->pChunks[i] );
    p->nChunks  = 1;
    p->nMemoryAlloc = p->nChunkSize;
    // transform these entries into a linked list
    p->pCurrent = p->pChunks[0];
    p->pEnd     = p->pCurrent + p->nChunkSize;
    p->nEntriesUsed = 0;
    p->nMemoryUsed = 0;
}